

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_do(connectdata *conn,_Bool *done)

{
  void **ppvVar1;
  _Bool connected;
  Curl_easy *pCVar2;
  CURLcode CVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  undefined8 *puVar7;
  ftp_parselist_data *pfVar8;
  curl_wildcard_states cVar9;
  curl_wildcard_states cVar10;
  Curl_easy *pCVar11;
  CURLcode local_3c;
  
  *done = false;
  (conn->proto).ftpc.wait_data_conn = false;
  pCVar11 = conn->data;
  if ((pCVar11->state).wildcardmatch == true) {
    cVar10 = CURLWC_CLEAN;
    do {
      switch((pCVar11->wildcard).state) {
      case CURLWC_INIT:
        goto switchD_00113cd1_caseD_1;
      case CURLWC_MATCHING:
        puVar7 = (undefined8 *)(pCVar11->wildcard).tmp;
        (pCVar11->set).fwrite_func = (curl_write_callback)puVar7[1];
        (pCVar11->set).out = (void *)puVar7[2];
        puVar7[1] = 0;
        puVar7[2] = 0;
        (pCVar11->wildcard).state = CURLWC_DOWNLOADING;
        CVar3 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar7);
        cVar9 = cVar10;
        if (CVar3 != CURLE_OK) break;
        if ((pCVar11->wildcard).filelist.size != 0) goto LAB_00113e80;
        CVar3 = CURLE_REMOTE_FILE_NOT_FOUND;
        goto LAB_001140ef;
      case CURLWC_DOWNLOADING:
        puVar7 = (undefined8 *)((pCVar11->wildcard).filelist.head)->ptr;
        pcVar4 = curl_maprintf("%s%s",(pCVar11->wildcard).path,*puVar7);
        local_3c = CURLE_OUT_OF_MEMORY;
        if (pcVar4 == (char *)0x0) goto LAB_001140fa;
        (*Curl_cfree)((conn->data->state).pathbuffer);
        pCVar2 = conn->data;
        (pCVar2->state).pathbuffer = pcVar4;
        (pCVar2->state).path = pcVar4;
        Curl_infof(pCVar2,"Wildcard - START of \"%s\"\n",*puVar7);
        if ((conn->data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
          Curl_set_in_callback(conn->data,true);
          lVar5 = (*(conn->data->set).chunk_bgn)
                            (puVar7,(pCVar11->wildcard).customptr,
                             (int)(pCVar11->wildcard).filelist.size);
          Curl_set_in_callback(conn->data,false);
          if (lVar5 == 2) {
            Curl_infof(conn->data,"Wildcard - \"%s\" skipped by user\n",*puVar7);
            cVar9 = CURLWC_SKIP;
            break;
          }
          if (lVar5 == 1) {
            local_3c = CURLE_CHUNK_FAILED;
            goto LAB_001140fa;
          }
        }
        cVar9 = CURLWC_SKIP;
        if (*(int *)(puVar7 + 1) == 0) {
          if ((*(byte *)(puVar7 + 0xc) & 0x40) != 0) {
            (conn->proto).ftpc.known_filesize = puVar7[5];
          }
          local_3c = ftp_parse_url_path(conn);
          if (local_3c != CURLE_OK) goto LAB_001140fa;
          Curl_llist_remove(&(pCVar11->wildcard).filelist,(pCVar11->wildcard).filelist.head,
                            (void *)0x0);
          CVar3 = CURLE_OK;
          local_3c = CURLE_OK;
          if ((pCVar11->wildcard).filelist.size != 0) goto LAB_001140fa;
          goto LAB_001140ef;
        }
        break;
      case CURLWC_CLEAN:
        puVar7 = (undefined8 *)(pCVar11->wildcard).tmp;
        if (puVar7 == (undefined8 *)0x0) {
          CVar3 = CURLE_OK;
          cVar10 = CURLWC_DONE;
        }
        else {
          CVar3 = Curl_ftp_parselist_geterror((ftp_parselist_data *)*puVar7);
          cVar10 = (CVar3 == CURLE_OK) + CURLWC_ERROR;
        }
        goto LAB_001140ef;
      case CURLWC_SKIP:
        if ((pCVar11->set).chunk_end != (curl_chunk_end_callback)0x0) {
          Curl_set_in_callback(pCVar11,true);
          (*(conn->data->set).chunk_end)((conn->data->wildcard).customptr);
          Curl_set_in_callback(conn->data,false);
        }
        Curl_llist_remove(&(pCVar11->wildcard).filelist,(pCVar11->wildcard).filelist.head,
                          (void *)0x0);
        cVar9 = ((pCVar11->wildcard).filelist.size == 0) + CURLWC_DOWNLOADING;
        break;
      default:
        local_3c = CURLE_OK;
        goto LAB_001140fa;
      }
      (pCVar11->wildcard).state = cVar9;
LAB_00113e80:
      pCVar11 = conn->data;
    } while( true );
  }
  CVar3 = ftp_parse_url_path(conn);
  if (CVar3 != CURLE_OK) {
    return CVar3;
  }
  pCVar11 = conn->data;
  goto LAB_0011411e;
switchD_00113cd1_caseD_1:
  pcVar4 = (pCVar11->state).path;
  pcVar6 = strrchr(pcVar4,0x2f);
  if (pcVar6 != (char *)0x0) {
    if (pcVar6[1] != '\0') {
      pcVar4 = pcVar6 + 1;
      pcVar6 = (*Curl_cstrdup)(pcVar4);
      (pCVar11->wildcard).pattern = pcVar6;
      goto LAB_00113faa;
    }
LAB_0011405b:
    (pCVar11->wildcard).state = CURLWC_CLEAN;
    CVar3 = ftp_parse_url_path(conn);
    goto LAB_001140d0;
  }
  if (*pcVar4 == '\0') goto LAB_0011405b;
  pcVar6 = (*Curl_cstrdup)(pcVar4);
  (pCVar11->wildcard).pattern = pcVar6;
LAB_00113faa:
  if (pcVar6 == (char *)0x0) {
LAB_001140cd:
    CVar3 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *pcVar4 = '\0';
    puVar7 = (undefined8 *)(*Curl_ccalloc)(1,0x18);
    if (puVar7 == (undefined8 *)0x0) {
      (*Curl_cfree)((pCVar11->wildcard).pattern);
      (pCVar11->wildcard).pattern = (char *)0x0;
      goto LAB_001140cd;
    }
    pfVar8 = Curl_ftp_parselist_data_alloc();
    *puVar7 = pfVar8;
    if (pfVar8 == (ftp_parselist_data *)0x0) {
      (*Curl_cfree)((pCVar11->wildcard).pattern);
      (pCVar11->wildcard).pattern = (char *)0x0;
      (*Curl_cfree)(puVar7);
      goto LAB_001140cd;
    }
    (pCVar11->wildcard).tmp = puVar7;
    (pCVar11->wildcard).tmp_dtor = wc_data_dtor;
    if ((conn->data->set).ftp_filemethod == FTPFILE_NOCWD) {
      (conn->data->set).ftp_filemethod = FTPFILE_MULTICWD;
    }
    ppvVar1 = &(pCVar11->wildcard).tmp;
    CVar3 = ftp_parse_url_path(conn);
    if (CVar3 == CURLE_OK) {
      pcVar4 = (*Curl_cstrdup)((conn->data->state).path);
      (pCVar11->wildcard).path = pcVar4;
      if (pcVar4 == (char *)0x0) {
        (*Curl_cfree)((pCVar11->wildcard).pattern);
        (pCVar11->wildcard).pattern = (char *)0x0;
        (*(pCVar11->wildcard).tmp_dtor)((pCVar11->wildcard).tmp);
        *ppvVar1 = (void *)0x0;
        (pCVar11->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
        goto LAB_001140cd;
      }
      pCVar2 = conn->data;
      puVar7[1] = (pCVar2->set).fwrite_func;
      (pCVar2->set).fwrite_func = Curl_ftp_parselist;
      puVar7[2] = (pCVar2->set).out;
      (pCVar2->set).out = conn;
      Curl_infof(pCVar2,"Wildcard - Parsing started\n");
      CVar3 = CURLE_OK;
    }
    else {
      (*Curl_cfree)((pCVar11->wildcard).pattern);
      (pCVar11->wildcard).pattern = (char *)0x0;
      (*(pCVar11->wildcard).tmp_dtor)((pCVar11->wildcard).tmp);
      *ppvVar1 = (void *)0x0;
      (pCVar11->wildcard).tmp_dtor = (curl_wildcard_tmp_dtor)0x0;
    }
  }
LAB_001140d0:
  local_3c = CVar3;
  if ((pCVar11->wildcard).state != CURLWC_CLEAN) {
    cVar10 = (uint)(CVar3 != CURLE_OK) * 4 + CURLWC_MATCHING;
LAB_001140ef:
    (pCVar11->wildcard).state = cVar10;
    local_3c = CVar3;
  }
LAB_001140fa:
  pCVar11 = conn->data;
  if (((pCVar11->wildcard).state | CURLWC_MATCHING) == CURLWC_DONE) {
    return CURLE_OK;
  }
  if (local_3c != CURLE_OK) {
    return local_3c;
  }
LAB_0011411e:
  (pCVar11->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar11,0);
  Curl_pgrsSetDownloadCounter(pCVar11,0);
  Curl_pgrsSetUploadSize(pCVar11,-1);
  Curl_pgrsSetDownloadSize(pCVar11,-1);
  (conn->proto).ftpc.ctl_valid = true;
  if ((conn->data->set).opt_no_body == true) {
    *(undefined4 *)((long)(conn->data->req).protop + 0x18) = 1;
  }
  *done = false;
  CVar3 = ftp_state_quote(conn,true,FTP_QUOTE);
  if (CVar3 == CURLE_OK) {
    CVar3 = ftp_multi_statemach(conn,done);
    connected = (conn->bits).tcpconnect[1];
    Curl_infof(conn->data,"ftp_perform ends with SECONDARY: %d\n",(ulong)connected);
    if (CVar3 == CURLE_OK) {
      if (*done != true) {
        return CURLE_OK;
      }
      CVar3 = ftp_dophase_done(conn,connected);
      return CVar3;
    }
  }
  freedirs(&(conn->proto).ftpc);
  return CVar3;
}

Assistant:

static CURLcode ftp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(conn->data->state.wildcardmatch) {
    result = wc_statemach(conn);
    if(conn->data->wildcard.state == CURLWC_SKIP ||
      conn->data->wildcard.state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(conn);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(conn, done);

  return result;
}